

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tetra-codec-impl.c
# Opt level: O2

Word32 pow2(tetra_codec *st,Word16 exponant,Word16 fraction)

{
  short var1;
  Word16 WVar1;
  uint uVar2;
  Word32 WVar3;
  long lVar4;
  undefined6 in_register_00000012;
  
  uVar2 = L_shl(st,(Word32)CONCAT62(in_register_00000012,fraction),6);
  lVar4 = (long)(short)(uVar2 >> 0x10);
  var1 = tab_pow2[lVar4];
  WVar1 = sub(st,var1,tab_pow2[lVar4 + 1]);
  WVar3 = L_msu(st,(int)var1 << 0x10,WVar1,(Word16)((uVar2 & 0xffff) >> 1));
  WVar1 = 0x7fff;
  if (-0x7fe2 < exponant) {
    WVar1 = 0x1e - exponant;
  }
  st->Overflow = (uint)(exponant < -0x7fe1);
  WVar3 = L_shr_r(st,WVar3,WVar1);
  return WVar3;
}

Assistant:

Word32 pow2(tetra_codec* st, Word16 exponant, Word16 fraction)
{
  Word16 exp, i, a, tmp;
  Word32 L_x;

  L_x = L_deposit_l(fraction);
  L_x = L_shl(st, L_x, (Word16)6 );
  i   = extract_h(L_x);				/* Extract b10-b16 of fraction */
  L_x = L_shr(st, L_x, (Word16)1 );
  a   = extract_l(L_x);				/* Extract b0-b9   of fraction */
  a   = a & (Word16)0x7fff;


  L_x = L_deposit_h(tab_pow2[i]);		/* tab_pow2[i] << 16 */
  tmp = sub(st, tab_pow2[i], tab_pow2[i+1]);	/* tab_pow2[i] - tab_pow2[i+1] */
  L_x = L_msu(st, L_x, tmp, a);			/* L_x -= tmp*a*2  */

  exp = sub(st,  (Word16)30, exponant );
  L_x = L_shr_r(st, L_x, exp);
  return(L_x);
}